

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

char * __thiscall llbuild::ninja::Token::getKindName(Token *this)

{
  Token *this_local;
  
  switch(this->tokenKind) {
  case Colon:
    this_local = (Token *)anon_var_dwarf_a318d;
    break;
  case Comment:
    this_local = (Token *)anon_var_dwarf_a31b0;
    break;
  case EndOfFile:
    this_local = (Token *)anon_var_dwarf_a31c6;
    break;
  case Equals:
    this_local = (Token *)anon_var_dwarf_a31dc;
    break;
  case Indentation:
    this_local = (Token *)anon_var_dwarf_a3208;
    break;
  case Identifier:
    this_local = (Token *)anon_var_dwarf_a31f2;
    break;
  case KWBuild:
    this_local = (Token *)anon_var_dwarf_a321e;
    break;
  case KWDefault:
    this_local = (Token *)anon_var_dwarf_a3228;
    break;
  case KWInclude:
    this_local = (Token *)anon_var_dwarf_a3232;
    break;
  case KWPool:
    this_local = (Token *)anon_var_dwarf_a323c;
    break;
  case KWRule:
    this_local = (Token *)0x31d074;
    break;
  case KWKindLast:
    this_local = (Token *)anon_var_dwarf_a3250;
    break;
  case Newline:
    this_local = (Token *)anon_var_dwarf_a325a;
    break;
  case Pipe:
    this_local = (Token *)0x31bba0;
    break;
  case PipePipe:
    this_local = (Token *)anon_var_dwarf_a327a;
    break;
  case String:
    this_local = (Token *)anon_var_dwarf_a3290;
    break;
  case Unknown:
    this_local = (Token *)anon_var_dwarf_a329a;
    break;
  default:
    this_local = (Token *)anon_var_dwarf_a32a4;
  }
  return (char *)this_local;
}

Assistant:

const char* Token::getKindName() const {
#define CASE(name) case Kind::name: return #name
  switch (tokenKind) {
    CASE(Colon);
    CASE(Comment);
    CASE(EndOfFile);
    CASE(Equals);
    CASE(Identifier);
    CASE(Indentation);
    CASE(KWBuild);
    CASE(KWDefault);
    CASE(KWInclude);
    CASE(KWPool);
    CASE(KWRule);
    CASE(KWSubninja);
    CASE(Newline);
    CASE(Pipe);
    CASE(PipePipe);
    CASE(String);
    CASE(Unknown);
  }
#undef CASE

  return "<invalid token kind>";
}